

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

ParseNode *
VisitBlock<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
          (ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator,
          _func_void_ParseNode_ptr_ByteCodeGenerator_ptr *prefix,
          _func_void_ParseNode_ptr_ByteCodeGenerator_ptr *postfix,ParseNode *pnodeParent)

{
  bool bVar1;
  bool bVar2;
  FuncInfo *this;
  ParseNodeBin *pPVar3;
  ParseNodePtr local_38;
  
  if (pnode == (ParseNode *)0x0) {
    local_38 = (ParseNode *)0x0;
  }
  else {
    bVar2 = false;
    if (byteCodeGenerator->isBinding == true) {
      if ((byteCodeGenerator->flags & 2) == 0) {
        bVar2 = false;
      }
      else {
        this = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
        bVar2 = FuncInfo::IsGlobalFunction(this);
      }
    }
    local_38 = (ParseNodePtr)0x0;
    while (pnode->nop == knopList) {
      pPVar3 = ParseNode::AsParseNodeBin(pnode);
      Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
                (pPVar3->pnode1,byteCodeGenerator,prefix,postfix,pnodeParent);
      if (bVar2 != false) {
        pPVar3 = ParseNode::AsParseNodeBin(pnode);
        bVar1 = MustProduceValue(pPVar3->pnode1,byteCodeGenerator->scriptContext);
        if (bVar1) {
          pPVar3 = ParseNode::AsParseNodeBin(pnode);
          local_38 = pPVar3->pnode1;
        }
        pPVar3 = ParseNode::AsParseNodeBin(pnode);
        bVar1 = IsJump(pPVar3->pnode1);
        if (bVar1) {
          bVar2 = false;
        }
      }
      pPVar3 = ParseNode::AsParseNodeBin(pnode);
      pnode = pPVar3->pnode2;
    }
    Visit<void(*)(ParseNode*,ByteCodeGenerator*),void(*)(ParseNode*,ByteCodeGenerator*)>
              (pnode,byteCodeGenerator,prefix,postfix,pnodeParent);
    if ((bVar2 != false) &&
       (bVar2 = MustProduceValue(pnode,byteCodeGenerator->scriptContext), bVar2)) {
      local_38 = pnode;
    }
  }
  return local_38;
}

Assistant:

ParseNode* VisitBlock(ParseNode *pnode, ByteCodeGenerator* byteCodeGenerator, PrefixFn prefix, PostfixFn postfix, ParseNode *pnodeParent = nullptr)
{
    ParseNode *pnodeLastVal = nullptr;
    if (pnode != nullptr)
    {
        bool fTrackVal = byteCodeGenerator->IsBinding() &&
            (byteCodeGenerator->GetFlags() & fscrReturnExpression) &&
            byteCodeGenerator->TopFuncInfo()->IsGlobalFunction();
        while (pnode->nop == knopList)
        {
            Visit(pnode->AsParseNodeBin()->pnode1, byteCodeGenerator, prefix, postfix, pnodeParent);
            if (fTrackVal)
            {
                // If we're tracking values, find the last statement (if any) in the block that is
                // guaranteed to produce a value.
                if (MustProduceValue(pnode->AsParseNodeBin()->pnode1, byteCodeGenerator->GetScriptContext()))
                {
                    pnodeLastVal = pnode->AsParseNodeBin()->pnode1;
                }
                if (IsJump(pnode->AsParseNodeBin()->pnode1))
                {
                    // This is a jump out of the current block. The remaining instructions (if any)
                    // will not be executed, so stop tracking them.
                    fTrackVal = false;
                }
            }
            pnode = pnode->AsParseNodeBin()->pnode2;
        }
        Visit(pnode, byteCodeGenerator, prefix, postfix, pnodeParent);
        if (fTrackVal)
        {
            if (MustProduceValue(pnode, byteCodeGenerator->GetScriptContext()))
            {
                pnodeLastVal = pnode;
            }
        }
    }
    return pnodeLastVal;
}